

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrFlagsResult ValidateXrSwapchainUsageFlags(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 0x100) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrSwapchainUsageFlags(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_SWAPCHAIN_USAGE_COLOR_ATTACHMENT_BIT) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_COLOR_ATTACHMENT_BIT since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_COLOR_ATTACHMENT_BIT;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_UNORDERED_ACCESS_BIT) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_UNORDERED_ACCESS_BIT since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_UNORDERED_ACCESS_BIT;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_TRANSFER_SRC_BIT) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_TRANSFER_SRC_BIT since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_TRANSFER_SRC_BIT;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_TRANSFER_DST_BIT) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_TRANSFER_DST_BIT since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_TRANSFER_DST_BIT;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_SAMPLED_BIT) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_SAMPLED_BIT since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_SAMPLED_BIT;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_MUTABLE_FORMAT_BIT) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_MUTABLE_FORMAT_BIT since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_MUTABLE_FORMAT_BIT;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_INPUT_ATTACHMENT_BIT_MND) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_INPUT_ATTACHMENT_BIT_MND since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_INPUT_ATTACHMENT_BIT_MND;
    }
    if ((int_value & XR_SWAPCHAIN_USAGE_INPUT_ATTACHMENT_BIT_KHR) != 0) {
        // Clear the value XR_SWAPCHAIN_USAGE_INPUT_ATTACHMENT_BIT_KHR since it is valid
        int_value &= ~XR_SWAPCHAIN_USAGE_INPUT_ATTACHMENT_BIT_KHR;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}